

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_ManComputeOutputRequired(Of_Man_t *p,int fCleanRefs)

{
  uint uVar1;
  Of_Obj_t *pOVar2;
  int iVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  Jf_Par_t *pJVar6;
  ulong uVar7;
  uint uVar8;
  Gia_Man_t *p_00;
  int iVar9;
  
  p_00 = p->pGia;
  uVar7 = 0;
  uVar4 = (ulong)(uint)p_00->nObjs;
  if (p_00->nObjs < 1) {
    uVar4 = uVar7;
  }
  for (; uVar4 * 0x20 != uVar7; uVar7 = uVar7 + 0x20) {
    pOVar2 = p->pObjs;
    *(undefined4 *)((long)&pOVar2->Required + uVar7) = 1000000000;
    if (fCleanRefs != 0) {
      *(undefined4 *)((long)&pOVar2->nRefs + uVar7) = 0;
    }
  }
  uVar8 = 0;
  for (iVar9 = 0; iVar3 = p_00->vCos->nSize, iVar9 < iVar3; iVar9 = iVar9 + 1) {
    pGVar5 = Gia_ManCo(p_00,iVar9);
    iVar3 = Gia_ObjFaninId0p(p_00,pGVar5);
    p_00 = p->pGia;
    uVar1 = p->pObjs[iVar3].Delay1;
    if ((int)uVar8 <= (int)uVar1) {
      uVar8 = uVar1;
    }
  }
  for (iVar9 = 0; iVar9 < iVar3; iVar9 = iVar9 + 1) {
    pGVar5 = Gia_ManCo(p_00,iVar9);
    iVar3 = Gia_ObjFaninId0p(p_00,pGVar5);
    pOVar2 = p->pObjs;
    if ((int)uVar8 < pOVar2[iVar3].Required) {
      pOVar2[iVar3].Required = uVar8;
    }
    if (fCleanRefs != 0) {
      pOVar2[iVar3].nRefs = pOVar2[iVar3].nRefs + 1;
    }
    p_00 = p->pGia;
    iVar3 = p_00->vCos->nSize;
  }
  pJVar6 = p->pPars;
  if ((pJVar6->Delay != 0) && (pJVar6->Delay < (ulong)uVar8)) {
    puts("Error: Delay violation.");
    pJVar6 = p->pPars;
  }
  pJVar6->Delay = (ulong)uVar8;
  return (int)pJVar6;
}

Assistant:

static inline int Of_ManComputeOutputRequired( Of_Man_t * p, int fCleanRefs )
{
    int i, Id, Delay = 0;
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
    {
        Of_ObjSetRequired( p, i, ABC_INFINITY );
        if ( fCleanRefs )
            Of_ObjSetRefNum( p, i, 0 );
    }
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Of_ObjDelay1(p, Id) );
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
    {
        Of_ObjUpdateRequired( p, Id, Delay );
        if ( fCleanRefs )
            Of_ObjRefInc( p, Id );
    }
    if ( p->pPars->Delay && p->pPars->Delay < Delay )
        printf( "Error: Delay violation.\n" );
    p->pPars->Delay = Delay;
    return Delay;
}